

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

size_t __thiscall Assimp::FBX::FBXExportProperty::size(FBXExportProperty *this)

{
  int iVar1;
  size_type sVar2;
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  FBXExportProperty *local_18;
  FBXExportProperty *this_local;
  
  iVar1 = (int)this->type;
  local_18 = this;
  if ((((1 < iVar1 - 0x43U) && (iVar1 != 0x46)) && (iVar1 != 0x49)) && (iVar1 != 0x4c)) {
    if (iVar1 - 0x52U < 2) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      return sVar2 + 5;
    }
    if (iVar1 != 0x59) {
      if ((iVar1 != 100) && (iVar1 != 0x69)) {
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Requested size on property of unknown type",&local_39);
        DeadlyImportError::DeadlyImportError(this_00,&local_38);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      return sVar2 + 0xd;
    }
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  return sVar2 + 1;
}

Assistant:

size_t FBXExportProperty::size() {
    switch (type) {
        case 'C':
        case 'Y':
        case 'I':
        case 'F':
        case 'D':
        case 'L':
            return data.size() + 1;
        case 'S':
        case 'R':
            return data.size() + 5;
        case 'i':
        case 'd':
            return data.size() + 13;
        default:
            throw DeadlyExportError("Requested size on property of unknown type");
    }
}